

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

double __thiscall duckdb_re2::trunc_abi_cxx11_(duckdb_re2 *this,double __x)

{
  StringPiece *in_RSI;
  double extraout_XMM0_Qa;
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  StringPiece local_20;
  
  if (in_RSI->size_ < 100) {
    StringPiece::operator_cast_to_string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,in_RSI);
    dVar1 = extraout_XMM0_Qa;
  }
  else {
    local_20 = StringPiece::substr(in_RSI,0,100);
    StringPiece::operator_cast_to_string(&local_40,&local_20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   &local_40,"...");
    dVar1 = (double)std::__cxx11::string::~string((string *)&local_40);
  }
  return dVar1;
}

Assistant:

static std::string trunc(const StringPiece& pattern) {
  if (pattern.size() < 100)
    return std::string(pattern);
  return std::string(pattern.substr(0, 100)) + "...";
}